

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O1

bool __thiscall benchmark::JSONReporter::ReportContext(JSONReporter *this,Context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  ostream *poVar4;
  char *pcVar5;
  string indent;
  char build_type [6];
  string inner_indent;
  string walltime_value;
  string local_d8;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88 [16];
  undefined4 local_78;
  undefined2 local_74;
  char *local_70;
  long local_68;
  char local_60 [16];
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  poVar4 = (this->super_BenchmarkReporter).output_stream_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x02');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"context\": {\n",0xd);
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,'\x04');
  LocalDateTimeString_abi_cxx11_();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"date","");
  StringPrintF_abi_cxx11_(&local_d8,"\"%s\": \"%s\"",local_b8._M_dataplus._M_p,local_50);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  paVar2 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"num_cpus","");
  anon_unknown_3::FormatKV(&local_d8,&local_b8,(long)context->num_cpus);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mhz_per_cpu","");
  anon_unknown_3::FormatKV(&local_d8,&local_b8,(long)(context->mhz_per_cpu + 0.5));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"cpu_scaling_enabled","");
  pcVar5 = "false";
  if (context->cpu_scaling_enabled != false) {
    pcVar5 = "true";
  }
  StringPrintF_abi_cxx11_(&local_d8,"\"%s\": %s",local_b8._M_dataplus._M_p,pcVar5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_74 = 0x67;
  local_78 = 0x75626564;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_98,local_90);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"library_build_type","");
  StringPrintF_abi_cxx11_(&local_d8,"\"%s\": \"%s\"",local_b8._M_dataplus._M_p,&local_78);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"},\n",3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"benchmarks\": [\n",0x10);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return true;
}

Assistant:

bool JSONReporter::ReportContext(const Context& context) {
  std::ostream& out = GetOutputStream();

  out << "{\n";
  std::string inner_indent(2, ' ');

  // Open context block and print context information.
  out << inner_indent << "\"context\": {\n";
  std::string indent(4, ' ');

  std::string walltime_value = LocalDateTimeString();
  out << indent << FormatKV("date", walltime_value) << ",\n";

  out << indent
      << FormatKV("num_cpus", static_cast<int64_t>(context.num_cpus))
      << ",\n";
  out << indent
      << FormatKV("mhz_per_cpu", RoundDouble(context.mhz_per_cpu))
      << ",\n";
  out << indent
      << FormatKV("cpu_scaling_enabled", context.cpu_scaling_enabled)
      << ",\n";

#if defined(NDEBUG)
  const char build_type[] = "release";
#else
  const char build_type[] = "debug";
#endif
  out << indent << FormatKV("library_build_type", build_type) << "\n";
  // Close context block and open the list of benchmarks.
  out << inner_indent << "},\n";
  out << inner_indent << "\"benchmarks\": [\n";
  return true;
}